

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderWindow.cpp
# Opt level: O1

void __thiscall sf::RenderWindow::setActive(RenderWindow *this)

{
  bool in_SIL;
  
  setActive((RenderWindow *)&this[-1].super_RenderTarget.m_cache.field_0x58,in_SIL);
  return;
}

Assistant:

bool RenderWindow::setActive(bool active)
{
    bool result = Window::setActive(active);

    // Update RenderTarget tracking
    if (result)
        RenderTarget::setActive(active);

    // If FBOs are available, make sure none are bound when we
    // try to draw to the default framebuffer of the RenderWindow
    if (active && result && priv::RenderTextureImplFBO::isAvailable())
    {
        priv::RenderTextureImplFBO::unbind();

        return true;
    }

    return result;
}